

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

void swap_data(bam1_core_t *c,int l_data,uint8_t *data,int is_host)

{
  ushort *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar12 = *(ulong *)&c->field_0x8;
  uVar11 = uVar12 >> 0x18 & 0xff;
  uVar4 = uVar12 >> 0x30;
  iVar2 = c->l_qseq;
  for (uVar9 = 0; uVar9 < uVar12 >> 0x30; uVar9 = uVar9 + 1) {
    uVar3 = *(uint *)(data + uVar9 * 4 + uVar11);
    *(uint *)(data + uVar9 * 4 + uVar11) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar12 = *(ulong *)&c->field_0x8;
  }
  puVar8 = (ulong *)(data + (long)((iVar2 + 1) / 2) + (long)iVar2 + uVar11 + uVar4 * 4);
  do {
    puVar7 = puVar8;
    if (data + l_data <= puVar7) {
      return;
    }
    uVar3 = aux_type2size(*(uint8_t *)((long)puVar7 + 2));
    puVar10 = (ulong *)((long)puVar7 + 3);
    uVar3 = uVar3 & 0xff;
    puVar8 = puVar10;
    switch(uVar3) {
    case 1:
      puVar8 = (ulong *)((long)puVar7 + 4);
      break;
    case 2:
      puVar1 = (ushort *)((long)puVar7 + 3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      puVar8 = (ulong *)((long)puVar7 + 5);
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar3 = *(uint *)((long)puVar7 + 3);
      *(uint *)((long)puVar7 + 3) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      puVar8 = (ulong *)((long)puVar7 + 7);
      break;
    case 8:
      uVar12 = *(ulong *)((long)puVar7 + 3);
      *(ulong *)((long)puVar7 + 3) =
           uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18
           | (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18
           | (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
      puVar8 = (ulong *)((long)puVar7 + 0xb);
      break;
    default:
      if (uVar3 == 0x42) {
        uVar3 = aux_type2size(*(uint8_t *)((long)puVar7 + 3));
        if (is_host == 0) {
          uVar5 = *(uint *)((long)puVar7 + 4);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          uVar6 = uVar5;
        }
        else {
          uVar5 = *(uint *)((long)puVar7 + 4);
          uVar6 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        }
        *(uint *)((long)puVar7 + 4) = uVar6;
        puVar8 = puVar7 + 1;
        switch(uVar3 & 0xff) {
        case 1:
          puVar8 = (ulong *)((long)puVar8 + (ulong)uVar5);
          break;
        case 2:
          while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
            *(ushort *)puVar8 = (ushort)*puVar8 << 8 | (ushort)*puVar8 >> 8;
            puVar8 = (ulong *)((long)puVar8 + 2);
          }
          break;
        case 4:
          while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
            uVar3 = (uint)*puVar8;
            *(uint *)puVar8 =
                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
            puVar8 = (ulong *)((long)puVar8 + 4);
          }
          break;
        case 8:
          while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
            uVar12 = *puVar8;
            *puVar8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                      (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                      (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                      (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
            puVar8 = puVar8 + 1;
          }
        }
      }
      else if ((uVar3 == 0x5a) || (uVar3 == 0x48)) {
        do {
          uVar12 = *puVar10;
          puVar8 = (ulong *)((long)puVar10 + 1);
          puVar10 = (ulong *)((long)puVar10 + 1);
        } while ((char)uVar12 != '\0');
      }
    }
  } while( true );
}

Assistant:

static void swap_data(const bam1_core_t *c, int l_data, uint8_t *data, int is_host)
{
    uint8_t *s;
    uint32_t *cigar = (uint32_t*)(data + c->l_qname);
    uint32_t i, n;
    s = data + c->n_cigar*4 + c->l_qname + c->l_qseq + (c->l_qseq + 1)/2;
    for (i = 0; i < c->n_cigar; ++i) ed_swap_4p(&cigar[i]);
    while (s < data + l_data) {
        int size;
        s += 2; // skip key
        size = aux_type2size(*s); ++s; // skip type
        switch (size) {
        case 1: ++s; break;
        case 2: ed_swap_2p(s); s += 2; break;
        case 4: ed_swap_4p(s); s += 4; break;
        case 8: ed_swap_8p(s); s += 8; break;
        case 'Z':
        case 'H':
            while (*s) ++s;
            ++s;
            break;
        case 'B':
            size = aux_type2size(*s); ++s;
            if (is_host) memcpy(&n, s, 4), ed_swap_4p(s);
            else ed_swap_4p(s), memcpy(&n, s, 4);
            s += 4;
            switch (size) {
            case 1: s += n; break;
            case 2: for (i = 0; i < n; ++i, s += 2) ed_swap_2p(s); break;
            case 4: for (i = 0; i < n; ++i, s += 4) ed_swap_4p(s); break;
            case 8: for (i = 0; i < n; ++i, s += 8) ed_swap_8p(s); break;
            }
            break;
        }
    }
}